

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O2

void CbDebugLog(char *msg,void *userdata)

{
  long in_FS_OFFSET;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    QDebug::operator<<(&local_20,msg);
    QDebug::~QDebug(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CbDebugLog(const char *msg, void *userdata)
{
    Q_UNUSED(userdata);
    qCDebug(lcMD) << msg;
}